

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::train(FastText *this,Args *args)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  invalid_argument *piVar4;
  ulong uVar5;
  shared_ptr<fasttext::Matrix> *in_RDI;
  bool normalizeGradient;
  shared_ptr<fasttext::Loss> loss;
  ifstream ifs;
  string *in_stack_00000140;
  FastText *in_stack_00000148;
  shared_ptr<fasttext::Args> *in_stack_fffffffffffffcf8;
  __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffd00;
  shared_ptr<fasttext::Matrix> *this_00;
  undefined7 in_stack_fffffffffffffd20;
  Args *in_stack_fffffffffffffd28;
  element_type *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  FastText *in_stack_fffffffffffffd58;
  shared_ptr<fasttext::Matrix> local_2a0 [3];
  undefined1 local_269;
  istream *in_stack_fffffffffffffd98;
  Dictionary *in_stack_fffffffffffffda0;
  undefined1 local_248 [24];
  FastText *in_stack_fffffffffffffdd0;
  FastText *in_stack_fffffffffffffdd8;
  
  std::make_shared<fasttext::Args,fasttext::Args_const&>(in_stack_fffffffffffffd28);
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x1b0328);
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&>
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffd28);
  std::shared_ptr<fasttext::Dictionary>::operator=
            ((shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffd00,
             (shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffcf8);
  std::shared_ptr<fasttext::Dictionary>::~shared_ptr((shared_ptr<fasttext::Dictionary> *)0x1b035d);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b0367);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8);
  if (bVar1) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Cannot use stdin for training!");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b03e8);
  std::ifstream::ifstream(local_248,(string *)&peVar3->input,_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    local_269 = 1;
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b0445);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd28,(char *)CONCAT17(bVar2,in_stack_fffffffffffffd20));
    std::invalid_argument::invalid_argument(piVar4,(string *)&stack0xfffffffffffffd98);
    local_269 = 0;
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffd00);
  Dictionary::readFromFile(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::ifstream::close();
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b053f);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b055c);
    getInputMatrixFromFile(in_stack_00000148,in_stack_00000140);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffd00,
               (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffcf8);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x1b059d);
  }
  else {
    createRandomMatrix(in_stack_fffffffffffffd58);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffd00,
               (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffcf8);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x1b05cd);
  }
  createTrainOutputMatrix((FastText *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48))
  ;
  this_00 = local_2a0;
  std::shared_ptr<fasttext::Matrix>::operator=
            (this_00,(shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffcf8);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x1b0605);
  *(undefined1 *)
   &in_RDI[6].super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 0
  ;
  createLoss(in_stack_fffffffffffffdd8,(shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffdd0);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b0629);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
            (&in_stack_fffffffffffffd38->wi_,in_RDI,
             (shared_ptr<fasttext::Loss> *)in_stack_fffffffffffffd28,
             (bool *)CONCAT17(bVar2,in_stack_fffffffffffffd20));
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)this_00,
             (shared_ptr<fasttext::Model> *)&stack0xfffffffffffffd38);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x1b067d);
  startThreads(in_stack_fffffffffffffdd0);
  std::shared_ptr<fasttext::Loss>::~shared_ptr((shared_ptr<fasttext::Loss> *)0x1b0693);
  std::ifstream::~ifstream(local_248);
  return;
}

Assistant:

void FastText::train(const Args& args) {
  args_ = std::make_shared<Args>(args);
  dict_ = std::make_shared<Dictionary>(args_);
  if (args_->input == "-") {
    // manage expectations
    throw std::invalid_argument("Cannot use stdin for training!");
  }
  std::ifstream ifs(args_->input);
  if (!ifs.is_open()) {
    throw std::invalid_argument(
        args_->input + " cannot be opened for training!");
  }
  //dict_->readFromFile(ifs);
  (*dict_).readFromFile(ifs);//its the same as above
  ifs.close();

  if (!args_->pretrainedVectors.empty()) {
    input_ = getInputMatrixFromFile(args_->pretrainedVectors);
  } else {
    input_ = createRandomMatrix();
  }
  output_ = createTrainOutputMatrix();
  quant_ = false;
  auto loss = createLoss(output_);
  bool normalizeGradient = (args_->model == model_name::sup);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
  startThreads();
}